

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

size_t luaO_str2num(char *s,TValue *o)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  size_t sVar6;
  lconv *plVar7;
  int iVar8;
  int mode;
  int mode_00;
  lua_Number lVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  lua_Number n;
  lua_Number local_100;
  char local_f8 [216];
  
  pbVar4 = (byte *)s;
  do {
    pbVar3 = pbVar4;
    bVar1 = *pbVar3;
    uVar12 = (ulong)bVar1;
    pbVar4 = pbVar3 + 1;
  } while ((""[uVar12 + 1] & 8) != 0);
  if (bVar1 == 0x2b) {
    iVar8 = 0;
LAB_0010cf02:
    uVar12 = (ulong)*pbVar4;
  }
  else {
    iVar8 = 1;
    if (bVar1 == 0x2d) goto LAB_0010cf02;
    iVar8 = 0;
    pbVar4 = pbVar3;
  }
  if (((char)uVar12 == '0') && ((pbVar4[1] | 0x20) == 0x78)) {
    uVar12 = (ulong)pbVar4[2];
    pbVar4 = pbVar4 + 2;
    if ((""[uVar12 + 1] & 0x10) == 0) goto LAB_0010cf6b;
    lVar9 = 0.0;
    do {
      cVar10 = (char)uVar12;
      if ((""[(long)cVar10 + 1] & 2) == 0) {
        iVar11 = ((int)cVar10 | 0x20U) - 0x57;
      }
      else {
        iVar11 = (int)cVar10 - 0x30;
      }
      lVar9 = (lua_Number)((long)iVar11 + (long)lVar9 * 0x10);
      uVar12 = (ulong)pbVar4[1];
      pbVar4 = pbVar4 + 1;
    } while ((""[uVar12 + 1] & 0x10) != 0);
LAB_0010cfb4:
    bVar2 = true;
  }
  else {
    if ((""[uVar12 + 1] & 2) != 0) {
      lVar9 = 0.0;
      do {
        iVar11 = (char)uVar12 + -0x30;
        if ((0xccccccccccccccb < (ulong)lVar9) &&
           ((lVar9 != 5.1488004017107686e-247 || (iVar8 + 7 < iVar11)))) goto LAB_0010cfec;
        lVar9 = (lua_Number)((long)iVar11 + (long)lVar9 * 10);
        uVar12 = (ulong)pbVar4[1];
        pbVar4 = pbVar4 + 1;
      } while ((""[uVar12 + 1] & 2) != 0);
      goto LAB_0010cfb4;
    }
LAB_0010cf6b:
    bVar2 = false;
    lVar9 = 0.0;
  }
  pbVar4 = pbVar4 + -1;
  do {
    pbVar3 = pbVar4 + 1;
    pbVar4 = pbVar4 + 1;
  } while ((""[(ulong)*pbVar3 + 1] & 8) != 0);
  if (bVar2 && *pbVar3 == 0) {
    local_100 = (lua_Number)-(long)lVar9;
    if (iVar8 == 0) {
      local_100 = lVar9;
    }
    iVar8 = 0x13;
LAB_0010d028:
    (o->value_).i = (lua_Integer)local_100;
    o->tt_ = iVar8;
    pbVar4 = pbVar4 + (1 - (long)s);
  }
  else {
LAB_0010cfec:
    pbVar4 = (byte *)strpbrk(s,".xXnN");
    if ((pbVar4 == (byte *)0x0) || ((*pbVar4 & 0xdf) != 0x4e)) {
      pbVar4 = (byte *)l_str2dloc(s,&local_100,mode);
      if (pbVar4 != (byte *)0x0) {
LAB_0010d01e:
        iVar8 = 3;
        goto LAB_0010d028;
      }
      pcVar5 = strchr(s,0x2e);
      sVar6 = strlen(s);
      if (pcVar5 != (char *)0x0 && sVar6 < 0xc9) {
        strcpy(local_f8,s);
        plVar7 = localeconv();
        pcVar5[(long)(local_f8 + -(long)s)] = *plVar7->decimal_point;
        pcVar5 = l_str2dloc(local_f8,&local_100,mode_00);
        if ((pcVar5 != (char *)0x0) && (s != (char *)0x0)) {
          pbVar4 = (byte *)(s + ((long)pcVar5 - (long)local_f8));
          goto LAB_0010d01e;
        }
      }
    }
    pbVar4 = (byte *)0x0;
  }
  return (size_t)pbVar4;
}

Assistant:

size_t luaO_str2num(const char *s, TValue *o) {
    lua_Integer i;
    lua_Number n;
    const char *e;
    if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
        setivalue(o, i);
    } else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
        setfltvalue(o, n);
    } else
        return 0;  /* conversion failed */
    return (e - s) + 1;  /* success; return string size */
}